

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

int read_function_entry(backtrace_state *state,dwarf_data *ddata,unit *u,uintptr_t base,
                       dwarf_buf *unit_buf,line_header *lhdr,backtrace_error_callback error_callback
                       ,void *data,function_vector *vec_function,function_vector *vec_inlined)

{
  dwarf_tag dVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  undefined1 auVar4 [8];
  int iVar5;
  int iVar6;
  uint64_t code;
  abbrev *paVar7;
  undefined1 (*string) [16];
  char *pcVar8;
  undefined4 *puVar9;
  byte bVar10;
  attr *attr;
  function_vector *vec;
  ulong uVar11;
  int unaff_R13D;
  bool bVar12;
  long lVar13;
  undefined1 auStack_1a8 [8];
  char b [200];
  undefined1 auStack_d8 [8];
  pcrange pcrange;
  uintptr_t local_80;
  uintptr_t base_local;
  attr_val val;
  int local_34;
  
  pcrange._48_8_ = &u->abbrevs;
  val.u.string = (char *)&ddata->dwarf_sections;
  local_80 = base;
  local_34 = unaff_R13D;
  do {
    if (unit_buf->left == 0) {
      return 1;
    }
    code = read_uleb128(unit_buf);
    iVar5 = 0;
    if (code == 0) {
      iVar5 = 1;
LAB_001324cb:
      bVar12 = false;
    }
    else {
      paVar7 = lookup_abbrev((abbrevs *)pcrange._48_8_,code,error_callback,data);
      if (paVar7 == (abbrev *)0x0) goto LAB_001324cb;
      dVar1 = paVar7->tag;
      bVar10 = (byte)(0x400020000008 >> ((byte)dVar1 & 0x3f)) & dVar1 < 0x2f;
      vec = vec_function;
      if (dVar1 == DW_TAG_inlined_subroutine) {
        vec = vec_inlined;
      }
      if (bVar10 == 1) {
        string = (undefined1 (*) [16])tcmalloc_backtrace_alloc(state,0x28,error_callback,data);
        if (string != (undefined1 (*) [16])0x0) {
          string[1] = (undefined1  [16])0x0;
          *string = (undefined1  [16])0x0;
          *(undefined8 *)string[2] = 0;
          goto LAB_001324d9;
        }
LAB_0013290d:
        bVar12 = false;
        iVar5 = 0;
      }
      else {
        string = (undefined1 (*) [16])0x0;
LAB_001324d9:
        pcrange.have_highpc = 0;
        pcrange.highpc_is_relative = 0;
        pcrange.highpc_is_addr_index = 0;
        pcrange._36_4_ = 0;
        pcrange.have_lowpc = 0;
        pcrange.lowpc_is_addr_index = 0;
        pcrange.highpc = 0;
        _auStack_d8 = (undefined1  [16])0x0;
        pcrange.ranges = 0;
        if (paVar7->num_attrs != 0) {
          lVar13 = 0;
          bVar12 = false;
          uVar11 = 0;
          do {
            iVar5 = read_attribute(*(dwarf_form *)((long)&paVar7->attrs->form + lVar13),
                                   *(uint64_t *)((long)&paVar7->attrs->val + lVar13),unit_buf,
                                   u->is_dwarf64,u->version,u->addrsize,
                                   (dwarf_sections *)val.u.string,ddata->altlink,
                                   (attr_val *)&base_local);
            if (iVar5 == 0) {
LAB_00132640:
              bVar3 = false;
              local_34 = 0;
            }
            else {
              if (((paVar7->tag == DW_TAG_skeleton_unit) || (paVar7->tag == DW_TAG_compile_unit)) &&
                 (*(int *)((long)&paVar7->attrs->name + lVar13) == 0x11)) {
                if ((int)base_local == 2) {
                  iVar5 = resolve_addr_index((dwarf_sections *)val.u.string,u->addr_base,u->addrsize
                                             ,ddata->is_bigendian,CONCAT44(val._4_4_,val.encoding),
                                             error_callback,data,&local_80);
                  if (iVar5 == 0) goto LAB_00132640;
                }
                else if ((int)base_local == 1) {
                  local_80 = CONCAT44(val._4_4_,val.encoding);
                }
              }
              if (bVar10 != 0) {
                iVar5 = *(int *)((long)&paVar7->attrs->name + lVar13);
                attr = (attr *)((long)&paVar7->attrs->name + lVar13);
                if (iVar5 < 0x55) {
                  if (iVar5 < 0x31) {
                    if (iVar5 - 0x11U < 2) {
LAB_00132736:
                      update_pcrange(attr,(attr_val *)&base_local,(pcrange *)auStack_d8);
                    }
                    else if (((iVar5 == 3) && (*(long *)*string == 0)) &&
                            (iVar5 = resolve_string((dwarf_sections *)val.u.string,u->is_dwarf64,
                                                    ddata->is_bigendian,u->str_offsets_base,
                                                    (attr_val *)&base_local,error_callback,data,
                                                    (char **)string), iVar5 == 0))
                    goto LAB_00132640;
                  }
                  else if ((iVar5 == 0x31) || (iVar5 == 0x47)) {
                    if (bVar12) {
                      bVar12 = true;
                    }
                    else {
                      pcVar8 = read_referenced_name_from_attr
                                         (ddata,u,attr,(attr_val *)&base_local,error_callback,data);
                      bVar12 = false;
                      if (pcVar8 != (char *)0x0) {
                        *(char **)*string = pcVar8;
                      }
                    }
                  }
                }
                else if (iVar5 < 0x59) {
                  if (iVar5 == 0x55) goto LAB_00132736;
                  if ((iVar5 == 0x58) && ((int)base_local == 3)) {
                    if (lhdr->filenames_count <= CONCAT44(val._4_4_,val.encoding)) {
                      snprintf(auStack_1a8,200,"%s in %s at %d",
                               "invalid file number in DW_AT_call_file attribute",unit_buf->name,
                               (ulong)(uint)(*(int *)&unit_buf->buf - *(int *)&unit_buf->start));
                      (*unit_buf->error_callback)(unit_buf->data,auStack_1a8,0);
                      goto LAB_00132640;
                    }
                    *(char **)(*string + 8) = lhdr->filenames[CONCAT44(val._4_4_,val.encoding)];
                  }
                }
                else if (iVar5 == 0x59) {
                  if ((int)base_local == 3) {
                    *(attr_val_encoding *)string[1] = val.encoding;
                  }
                }
                else if ((iVar5 == 0x6e) || (iVar5 == 0x2007)) {
                  auVar2._8_8_ = 0;
                  auVar2[0] = b[0];
                  auVar2[1] = b[1];
                  auVar2[2] = b[2];
                  auVar2[3] = b[3];
                  auVar2[4] = b[4];
                  auVar2[5] = b[5];
                  auVar2[6] = b[6];
                  auVar2[7] = b[7];
                  _auStack_1a8 = auVar2 << 0x40;
                  iVar5 = resolve_string((dwarf_sections *)val.u.string,u->is_dwarf64,
                                         ddata->is_bigendian,u->str_offsets_base,
                                         (attr_val *)&base_local,error_callback,data,
                                         (char **)auStack_1a8);
                  if (iVar5 == 0) {
                    local_34 = 0;
                  }
                  else if (auStack_1a8 != (undefined1  [8])0x0) {
                    *(undefined1 (*) [8])*string = auStack_1a8;
                    bVar12 = true;
                  }
                  if (iVar5 == 0) {
                    bVar3 = false;
                    goto LAB_00132797;
                  }
                }
              }
              bVar3 = true;
            }
LAB_00132797:
            if (!bVar3) {
              bVar12 = false;
              iVar5 = local_34;
              goto LAB_00132a13;
            }
            uVar11 = uVar11 + 1;
            lVar13 = lVar13 + 0x10;
          } while (uVar11 < paVar7->num_attrs);
        }
        bVar12 = true;
        if (bVar10 == 0) {
LAB_001328ca:
          if (paVar7->has_children != 0) {
            if (bVar12) {
              iVar5 = read_function_entry(state,ddata,u,local_80,unit_buf,lhdr,error_callback,data,
                                          vec_function,vec_inlined);
              if (iVar5 == 0) goto LAB_0013290d;
            }
            else {
              b[8] = '\0';
              b[9] = '\0';
              b[10] = '\0';
              b[0xb] = '\0';
              b[0xc] = '\0';
              b[0xd] = '\0';
              b[0xe] = '\0';
              b[0xf] = '\0';
              b[0x10] = '\0';
              b[0x11] = '\0';
              b[0x12] = '\0';
              b[0x13] = '\0';
              b[0x14] = '\0';
              b[0x15] = '\0';
              b[0x16] = '\0';
              b[0x17] = '\0';
              _auStack_1a8 = (undefined1  [16])0x0;
              iVar5 = read_function_entry(state,ddata,u,local_80,unit_buf,lhdr,error_callback,data,
                                          vec_function,(function_vector *)auStack_1a8);
              if (iVar5 == 0) {
LAB_00132a02:
                bVar12 = false;
                local_34 = 0;
              }
              else {
                bVar12 = true;
                if (b._16_8_ != 0) {
                  puVar9 = (undefined4 *)
                           tcmalloc_backtrace_vector_grow
                                     (state,0x18,error_callback,data,(backtrace_vector *)auStack_1a8
                                     );
                  if (puVar9 != (undefined4 *)0x0) {
                    *puVar9 = 0xffffffff;
                    puVar9[1] = 0xffffffff;
                    puVar9[2] = 0xffffffff;
                    puVar9[3] = 0xffffffff;
                    *(undefined8 *)(puVar9 + 4) = 0;
                    iVar5 = tcmalloc_backtrace_vector_release
                                      (state,(backtrace_vector *)auStack_1a8,error_callback,data);
                    if (iVar5 != 0) {
                      auVar4 = auStack_1a8;
                      tcmalloc_backtrace_qsort
                                ((void *)auStack_1a8,b._16_8_,0x18,function_addrs_compare);
                      *(undefined1 (*) [8])(string[1] + 8) = auVar4;
                      *(undefined8 *)string[2] = b._16_8_;
                      goto LAB_00132a08;
                    }
                  }
                  goto LAB_00132a02;
                }
              }
LAB_00132a08:
              if (!bVar12) {
                bVar12 = false;
                iVar5 = local_34;
                goto LAB_00132a13;
              }
            }
          }
          bVar12 = true;
          iVar5 = local_34;
        }
        else {
          if (*(long *)*string == 0) {
LAB_001328b8:
            tcmalloc_backtrace_free(state,string,0x28,error_callback,data);
            goto LAB_001328ca;
          }
          if (bVar10 == 0) goto LAB_001328ca;
          if (((int)pcrange.ranges == 0) &&
             (((int)pcrange.lowpc == 0 || ((int)pcrange.highpc == 0)))) goto LAB_001328b8;
          iVar6 = add_ranges(state,(dwarf_sections *)val.u.string,
                             (libbacktrace_base_address)(ddata->base_address).m,ddata->is_bigendian,
                             u,local_80,(pcrange *)auStack_d8,add_function_range,string,
                             error_callback,data,vec);
          bVar12 = false;
          iVar5 = 0;
          if (iVar6 != 0) goto LAB_001328ca;
        }
      }
    }
LAB_00132a13:
    local_34 = iVar5;
    if (!bVar12) {
      return local_34;
    }
  } while( true );
}

Assistant:

static int
read_function_entry (struct backtrace_state *state, struct dwarf_data *ddata,
		     struct unit *u, uintptr_t base, struct dwarf_buf *unit_buf,
		     const struct line_header *lhdr,
		     backtrace_error_callback error_callback, void *data,
		     struct function_vector *vec_function,
		     struct function_vector *vec_inlined)
{
  while (unit_buf->left > 0)
    {
      uint64_t code;
      const struct abbrev *abbrev;
      int is_function;
      struct function *function;
      struct function_vector *vec;
      size_t i;
      struct pcrange pcrange;
      int have_linkage_name;

      code = read_uleb128 (unit_buf);
      if (code == 0)
	return 1;

      abbrev = lookup_abbrev (&u->abbrevs, code, error_callback, data);
      if (abbrev == NULL)
	return 0;

      is_function = (abbrev->tag == DW_TAG_subprogram
		     || abbrev->tag == DW_TAG_entry_point
		     || abbrev->tag == DW_TAG_inlined_subroutine);

      if (abbrev->tag == DW_TAG_inlined_subroutine)
	vec = vec_inlined;
      else
	vec = vec_function;

      function = NULL;
      if (is_function)
	{
	  function = ((struct function *)
		      backtrace_alloc (state, sizeof *function,
				       error_callback, data));
	  if (function == NULL)
	    return 0;
	  memset (function, 0, sizeof *function);
	}

      memset (&pcrange, 0, sizeof pcrange);
      have_linkage_name = 0;
      for (i = 0; i < abbrev->num_attrs; ++i)
	{
	  struct attr_val val;

	  if (!read_attribute (abbrev->attrs[i].form, abbrev->attrs[i].val,
			       unit_buf, u->is_dwarf64, u->version,
			       u->addrsize, &ddata->dwarf_sections,
			       ddata->altlink, &val))
	    return 0;

	  /* The compile unit sets the base address for any address
	     ranges in the function entries.  */
	  if ((abbrev->tag == DW_TAG_compile_unit
	       || abbrev->tag == DW_TAG_skeleton_unit)
	      && abbrev->attrs[i].name == DW_AT_low_pc)
	    {
	      if (val.encoding == ATTR_VAL_ADDRESS)
		base = (uintptr_t) val.u.uint;
	      else if (val.encoding == ATTR_VAL_ADDRESS_INDEX)
		{
		  if (!resolve_addr_index (&ddata->dwarf_sections,
					   u->addr_base, u->addrsize,
					   ddata->is_bigendian, val.u.uint,
					   error_callback, data, &base))
		    return 0;
		}
	    }

	  if (is_function)
	    {
	      switch (abbrev->attrs[i].name)
		{
		case DW_AT_call_file:
		  if (val.encoding == ATTR_VAL_UINT)
		    {
		      if (val.u.uint >= lhdr->filenames_count)
			{
			  dwarf_buf_error (unit_buf,
					   ("invalid file number in "
					    "DW_AT_call_file attribute"),
					   0);
			  return 0;
			}
		      function->caller_filename = lhdr->filenames[val.u.uint];
		    }
		  break;

		case DW_AT_call_line:
		  if (val.encoding == ATTR_VAL_UINT)
		    function->caller_lineno = val.u.uint;
		  break;

		case DW_AT_abstract_origin:
		case DW_AT_specification:
		  /* Second name preference: override DW_AT_name, don't override
		     DW_AT_linkage_name.  */
		  if (have_linkage_name)
		    break;
		  {
		    const char *name;

		    name
		      = read_referenced_name_from_attr (ddata, u,
							&abbrev->attrs[i], &val,
							error_callback, data);
		    if (name != NULL)
		      function->name = name;
		  }
		  break;

		case DW_AT_name:
		  /* Third name preference: don't override.  */
		  if (function->name != NULL)
		    break;
		  if (!resolve_string (&ddata->dwarf_sections, u->is_dwarf64,
				       ddata->is_bigendian,
				       u->str_offsets_base, &val,
				       error_callback, data, &function->name))
		    return 0;
		  break;

		case DW_AT_linkage_name:
		case DW_AT_MIPS_linkage_name:
		  /* First name preference: override all.  */
		  {
		    const char *s;

		    s = NULL;
		    if (!resolve_string (&ddata->dwarf_sections, u->is_dwarf64,
					 ddata->is_bigendian,
					 u->str_offsets_base, &val,
					 error_callback, data, &s))
		      return 0;
		    if (s != NULL)
		      {
			function->name = s;
			have_linkage_name = 1;
		      }
		  }
		  break;

		case DW_AT_low_pc: case DW_AT_high_pc: case DW_AT_ranges:
		  update_pcrange (&abbrev->attrs[i], &val, &pcrange);
		  break;

		default:
		  break;
		}
	    }
	}

      /* If we couldn't find a name for the function, we have no use
	 for it.  */
      if (is_function && function->name == NULL)
	{
	  backtrace_free (state, function, sizeof *function,
			  error_callback, data);
	  is_function = 0;
	}

      if (is_function)
	{
	  if (pcrange.have_ranges
	      || (pcrange.have_lowpc && pcrange.have_highpc))
	    {
	      if (!add_ranges (state, &ddata->dwarf_sections,
			       ddata->base_address, ddata->is_bigendian,
			       u, base, &pcrange, add_function_range,
			       (void *) function, error_callback, data,
			       (void *) vec))
		return 0;
	    }
	  else
	    {
	      backtrace_free (state, function, sizeof *function,
			      error_callback, data);
	      is_function = 0;
	    }
	}

      if (abbrev->has_children)
	{
	  if (!is_function)
	    {
	      if (!read_function_entry (state, ddata, u, base, unit_buf, lhdr,
					error_callback, data, vec_function,
					vec_inlined))
		return 0;
	    }
	  else
	    {
	      struct function_vector fvec;

	      /* Gather any information for inlined functions in
		 FVEC.  */

	      memset (&fvec, 0, sizeof fvec);

	      if (!read_function_entry (state, ddata, u, base, unit_buf, lhdr,
					error_callback, data, vec_function,
					&fvec))
		return 0;

	      if (fvec.count > 0)
		{
		  struct function_addrs *p;
		  struct function_addrs *faddrs;

		  /* Allocate a trailing entry, but don't include it
		     in fvec.count.  */
		  p = ((struct function_addrs *)
		       backtrace_vector_grow (state,
					      sizeof (struct function_addrs),
					      error_callback, data,
					      &fvec.vec));
		  if (p == NULL)
		    return 0;
		  p->low = 0;
		  --p->low;
		  p->high = p->low;
		  p->function = NULL;

		  if (!backtrace_vector_release (state, &fvec.vec,
						 error_callback, data))
		    return 0;

		  faddrs = (struct function_addrs *) fvec.vec.base;
		  backtrace_qsort (faddrs, fvec.count,
				   sizeof (struct function_addrs),
				   function_addrs_compare);

		  function->function_addrs = faddrs;
		  function->function_addrs_count = fvec.count;
		}
	    }
	}
    }

  return 1;
}